

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGReader.cpp
# Opt level: O0

CfgNode * CFGReader::nodeWithAddr(CFG *cfg,Addr addr)

{
  Data *data;
  CfgNode *local_20;
  CfgNode *node;
  Addr addr_local;
  CFG *cfg_local;
  
  if (cfg == (CFG *)0x0) {
    __assert_fail("cfg != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGReader.cpp"
                  ,0x53,"static CfgNode *CFGReader::nodeWithAddr(CFG *, Addr)");
  }
  if (addr != 0) {
    local_20 = CFG::nodeByAddr(cfg,addr);
    if (local_20 == (CfgNode *)0x0) {
      local_20 = (CfgNode *)operator_new(0x18);
      CfgNode::CfgNode(local_20,CFG_PHANTOM);
      data = (Data *)operator_new(0x10);
      CfgNode::PhantomData::PhantomData((PhantomData *)data,addr);
      CfgNode::setData(local_20,data);
      CFG::addNode(cfg,local_20);
    }
    return local_20;
  }
  __assert_fail("addr != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGReader.cpp"
                ,0x54,"static CfgNode *CFGReader::nodeWithAddr(CFG *, Addr)");
}

Assistant:

CfgNode* CFGReader::nodeWithAddr(CFG* cfg, Addr addr) {
	assert(cfg != 0);
	assert(addr != 0);

	CfgNode* node = cfg->nodeByAddr(addr);
	if (node == 0) {
		node = new CfgNode(CfgNode::CFG_PHANTOM);
		node->setData(new CfgNode::PhantomData(addr));
		cfg->addNode(node);
	}

	return node;
}